

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyScoped_NoFastPath<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  unsigned_short localRegisterID;
  ushort uVar1;
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar2;
  InlineCache *inlineCache;
  FrameDisplay *pDisplay;
  
  pvVar2 = GetReg<unsigned_int>(this,1);
  localRegisterID = playout->Value;
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  uVar1 = playout->inlineCacheIndex;
  pDisplay = GetEnvForEvalCode(this);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pvVar2 = JavascriptOperators::PatchGetPropertyScoped<false,Js::InlineCache>
                     (functionBody,inlineCache,(uint)uVar1,pDisplay,propertyId,pvVar2);
  SetReg<unsigned_short>(this,localRegisterID,pvVar2);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetPropertyScoped_NoFastPath(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        // Implicit root object as default instance
        Var defaultInstance = GetReg(Js::FunctionBody::RootObjectRegSlot);

        // PatchGetPropertyScoped doesn't update type and slotIndex if the scope is not an array of length 1.
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                defaultInstance));
    }